

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

void pgraph_dump_dma_nv4(int cnum,pgraph_state *state)

{
  Register *pRVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  pointer puVar4;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  local_40;
  
  hwtest::pgraph::pgraph_dma_nv4_regs(&local_40,&state->chipset);
  for (puVar4 = local_40.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 != local_40.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    pRVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    iVar2 = (*pRVar1->_vptr_Register[6])(pRVar1,cnum);
    pRVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    iVar3 = (*pRVar1->_vptr_Register[3])(pRVar1,state);
    *(int *)CONCAT44(extraout_var,iVar3) = iVar2;
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

void pgraph_dump_dma_nv4(int cnum, struct pgraph_state *state) {
	for (auto &reg : pgraph_dma_nv4_regs(state->chipset)) {
		reg->ref(state) = reg->read(cnum);
	}
}